

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall Gc::registerThread(Gc *this,uint64_t threadId)

{
  HashTableEntry<unsigned_long,_bool> *pHVar1;
  Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *in_RDI;
  bool bVar2;
  HashTableIterator<unsigned_long,_bool> it;
  unsigned_long in_stack_00000040;
  HashTable<unsigned_long,_bool,_axl::sl::HashId<unsigned_long>,_axl::sl::Eq<unsigned_long,_unsigned_long>,_unsigned_long,_const_bool_&>
  *in_stack_00000048;
  Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>
  *in_stack_ffffffffffffffc8;
  IteratorImpl<axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>
  local_20 [4];
  
  axl::sl::
  HashTable<unsigned_long,_bool,_axl::sl::HashId<unsigned_long>,_axl::sl::Eq<unsigned_long,_unsigned_long>,_unsigned_long,_const_bool_&>
  ::visit(in_stack_00000048,in_stack_00000040);
  axl::sl::HashTableIterator<unsigned_long,_bool>::HashTableIterator
            ((HashTableIterator<unsigned_long,_bool> *)in_RDI,in_stack_ffffffffffffffc8);
  pHVar1 = axl::sl::
           IteratorImpl<axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>
           ::operator->(local_20);
  bVar2 = ((pHVar1->super_MapEntry<unsigned_long,_bool>).m_value & 1U) == 0;
  if (bVar2) {
    axl::sl::Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::append
              (in_RDI,(ValueArg)in_stack_ffffffffffffffc8,0x1202e9);
    pHVar1 = axl::sl::
             IteratorImpl<axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>
             ::operator->(local_20);
    (pHVar1->super_MapEntry<unsigned_long,_bool>).m_value = true;
  }
  return bVar2;
}

Assistant:

bool
	registerThread(uint64_t threadId) {
		sl::HashTableIterator<uint64_t, bool> it = m_threadMap.visit(threadId);
		if (it->m_value)
			return false;

		m_threadArray.append(threadId);
		it->m_value = true;
		return true;
	}